

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          *handler)

{
  ulong uVar1;
  internal *end;
  wchar_t wVar2;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *pfVar3;
  size_t sVar4;
  internal *piVar5;
  internal *piVar6;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *this_00;
  basic_buffer<wchar_t> *c;
  internal *piVar7;
  internal *piVar8;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
             *)format_str.size_;
  if (format_str.data_ == (wchar_t *)0x0) {
    return;
  }
  end = this + (long)format_str.data_ * 4;
  piVar8 = this;
  do {
    wVar2 = *(wchar_t *)piVar8;
    piVar6 = piVar8;
    while (wVar2 != L'{') {
      piVar6 = piVar6 + 4;
      piVar7 = piVar8;
      if (piVar6 == end) goto LAB_001486d5;
      wVar2 = *(wchar_t *)piVar6;
    }
    piVar7 = piVar8;
    if (piVar8 != piVar6) {
      do {
        while (piVar5 = piVar7, piVar7 = piVar5 + 4, *(wchar_t *)piVar5 == L'}') {
          if ((piVar7 == piVar6) || (*(wchar_t *)piVar7 != L'}')) goto LAB_0014872a;
          this = (internal *)this_00;
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)piVar8,(wchar_t *)piVar7);
          piVar8 = piVar5 + 8;
          piVar7 = piVar8;
          if (piVar8 == piVar6) {
            piVar8 = piVar5 + 8;
            goto LAB_001485c7;
          }
        }
      } while (piVar7 != piVar6);
LAB_001485c7:
      this = (internal *)this_00;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ::on_text(this_00,(wchar_t *)piVar8,(wchar_t *)piVar6);
    }
    piVar6 = piVar6 + 4;
    if (piVar6 == end) {
      error_handler::on_error((error_handler *)this,"invalid format string");
    }
    if ((char)*(int *)piVar6 == '}') {
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
      ::next_arg((format_arg *)&local_58.string,&this_00->context);
      (this_00->arg).type_ = local_48;
      (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
      (this_00->arg).value_.field_0.string.size = local_58.string.size;
      piVar8 = piVar6;
LAB_00148607:
      piVar6 = piVar8;
      this = (internal *)this_00;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ::on_replacement_field(this_00,(wchar_t *)piVar6);
    }
    else if (*(int *)piVar6 == 0x7b) {
      pfVar3 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                *)(this_00->context).
                  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                  .out_.container;
      sVar4 = (pfVar3->context).
              super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
              .parse_context_.format_str_.size_;
      uVar1 = sVar4 + 1;
      if (*(ulong *)&(pfVar3->context).
                     super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                     .parse_context_.next_arg_id_ < uVar1) {
        this = (internal *)pfVar3;
        (*(code *)**(undefined8 **)&pfVar3->field_0x0)(pfVar3,uVar1);
      }
      (pfVar3->context).
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
      .parse_context_.format_str_.size_ = uVar1;
      (pfVar3->context).
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
      .parse_context_.format_str_.data_[sVar4] = *(wchar_t *)piVar6;
      (this_00->context).
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
      .out_.container = (basic_buffer<wchar_t> *)pfVar3;
    }
    else {
      local_58._0_8_ = this_00;
      piVar8 = (internal *)
               parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                         ((wchar_t *)piVar6,(wchar_t *)end,
                          (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                           *)&local_58.string);
      if (piVar8 == end) {
LAB_00148742:
        error_handler::on_error((error_handler *)piVar6,"missing \'}\' in format string");
      }
      if (*(wchar_t *)piVar8 != L':') {
        if (*(wchar_t *)piVar8 != L'}') goto LAB_00148742;
        goto LAB_00148607;
      }
      this = (internal *)this_00;
      piVar6 = (internal *)
               format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ::on_format_specs(this_00,(wchar_t *)(piVar8 + 4),(wchar_t *)end);
      if ((piVar6 == end) || (*(wchar_t *)piVar6 != L'}')) {
        error_handler::on_error((error_handler *)this,"unknown format specifier");
      }
    }
    piVar8 = piVar6 + 4;
    if (piVar8 == end) {
      return;
    }
  } while( true );
LAB_001486d5:
  piVar6 = piVar7;
  piVar7 = piVar6 + 4;
  if (*(wchar_t *)piVar6 == L'}') {
    if ((piVar7 == end) || (*(int *)piVar7 != 0x7d)) {
LAB_0014872a:
      error_handler::on_error((error_handler *)this,"unmatched \'}\' in format string");
    }
    this = (internal *)this_00;
    format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::on_text(this_00,(wchar_t *)piVar8,(wchar_t *)piVar7);
    piVar8 = piVar6 + 8;
    piVar7 = piVar8;
    if (piVar8 == end) {
      piVar8 = piVar6 + 8;
      goto LAB_00148710;
    }
    goto LAB_001486d5;
  }
  if (piVar7 == end) {
LAB_00148710:
    format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::on_text(this_00,(wchar_t *)piVar8,(wchar_t *)end);
    return;
  }
  goto LAB_001486d5;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}